

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcBlendEquationAdvancedTests.cpp
# Opt level: O2

void __thiscall
glcts::BlendTestCaseGroup::BlendTest::BlendTest
          (BlendTest *this,Context *context,GLSLVersion glslVersion,GLenum mode,bool useAllQualifier
          ,int numColors,GLfloat *colors)

{
  char *pcVar1;
  undefined3 in_register_00000081;
  allocator<char> local_75;
  int local_74;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_74 = numColors;
  pcVar1 = GetModeStr(mode);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,pcVar1,&local_75);
  pcVar1 = fixed_sample_locations_values + 1;
  if (CONCAT31(in_register_00000081,useAllQualifier) != 0) {
    pcVar1 = "_all_qualifier";
  }
  std::operator+(&local_70,&local_50,pcVar1);
  deqp::TestCase::TestCase
            (&this->super_TestCase,context,local_70._M_dataplus._M_p,
             "Test new blend modes for correctness.");
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TestCase_01e04bc0;
  this->m_glslVersion = glslVersion;
  this->m_mode = mode;
  this->m_useAllQualifier = useAllQualifier;
  this->m_numColors = local_74;
  this->m_colors = colors;
  return;
}

Assistant:

BlendTest(deqp::Context& context, glu::GLSLVersion glslVersion, glw::GLenum mode, bool useAllQualifier,
				  int numColors, const glw::GLfloat* colors)
			: TestCase(context, (std::string(GetModeStr(mode)) + (useAllQualifier ? "_all_qualifier" : "")).c_str(),
					   "Test new blend modes for correctness.")
			, m_glslVersion(glslVersion)
			, m_mode(mode)
			, m_useAllQualifier(useAllQualifier)
			, m_numColors(numColors)
			, m_colors(colors)
		{
		}